

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool despot::Variable::IsVariableCurrName
               (string *name,vector<despot::StateVar,_std::allocator<despot::StateVar>_> *vars)

{
  __type_conflict _Var1;
  size_type sVar2;
  const_reference this;
  string *__rhs;
  StateVar *var;
  int i;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *vars_local;
  string *name_local;
  
  var._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size(vars);
    if (sVar2 <= (ulong)(long)var._4_4_) {
      return false;
    }
    this = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                     (vars,(long)var._4_4_);
    __rhs = StateVar::curr_name_abi_cxx11_(this);
    _Var1 = std::operator==(name,__rhs);
    if (_Var1) break;
    var._4_4_ = var._4_4_ + 1;
  }
  return true;
}

Assistant:

bool Variable::IsVariableCurrName(string name, const vector<StateVar>& vars) {
	for (int i = 0; i < vars.size(); i++) {
		const StateVar& var = vars[i];
		if (name == var.curr_name())
			return true;
	}
	return false;
}